

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessBuffersTests.cpp
# Opt level: O3

bool __thiscall
gl4cts::DirectStateAccess::Buffers::MapRangeReadBitTest::CompareWithReference
          (MapRangeReadBitTest *this,GLuint *data,GLintptr offset,GLsizei length)

{
  ostringstream *poVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  undefined1 local_198 [120];
  ios_base local_120 [264];
  
  if (data == (GLuint *)0x0) {
    local_198._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    poVar1 = (ostringstream *)(local_198 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"glMapNamedBufferRange called with offset ",0x29);
    std::ostream::_M_insert<long>((long)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," and length ",0xc);
    std::ostream::operator<<(poVar1,length);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1," returned NULL pointer, but buffer\'s data was expected.",0x37);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_120);
  }
  else {
    uVar3 = (ulong)(length + offset) >> 2;
    if ((uint)((ulong)offset >> 2) < (uint)uVar3) {
      uVar2 = (ulong)offset >> 2 & 0xffffffff;
      lVar4 = 0;
      do {
        if (data[lVar4] != *(GLuint *)(s_reference + uVar2 * 4 + lVar4 * 4)) {
          local_198._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
          poVar1 = (ostringstream *)(local_198 + 8);
          std::__cxx11::ostringstream::ostringstream(poVar1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,"glMapNamedBufferRange called with offset ",0x29);
          std::ostream::_M_insert<long>((long)poVar1);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," and length ",0xc);
          std::ostream::operator<<(poVar1,length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,
                     " returned pointer to data which is not identical to reference data.",0x43);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream(poVar1);
          std::ios_base::~ios_base(local_120);
          return false;
        }
        lVar4 = lVar4 + 1;
      } while ((uVar3 & 0xffffffff) - uVar2 != lVar4);
    }
  }
  return true;
}

Assistant:

bool MapRangeReadBitTest::CompareWithReference(glw::GLuint* data, glw::GLintptr offset, glw::GLsizei length)
{
	if (DE_NULL == data)
	{
		/* Log. */
		m_context.getTestContext().getLog()
			<< tcu::TestLog::Message << "glMapNamedBufferRange called with offset " << offset << " and length "
			<< length << " returned NULL pointer, but buffer's data was expected." << tcu::TestLog::EndMessage;
	}
	else
	{
		glw::GLuint start = static_cast<glw::GLuint>((offset) / sizeof(s_reference[0]));
		glw::GLuint end   = static_cast<glw::GLuint>((offset + length) / sizeof(s_reference[0]));

		/* Comparison results with reference data. */
		for (glw::GLuint i = start; i < end; ++i)
		{
#if (DE_COMPILER == DE_COMPILER_GCC)
#pragma GCC diagnostic push
#pragma GCC diagnostic ignored "-Warray-bounds"
#endif
			if (data[i - start] != s_reference[i])
			{
				/* Log. */
				m_context.getTestContext().getLog()
					<< tcu::TestLog::Message << "glMapNamedBufferRange called with offset " << offset << " and length "
					<< length << " returned pointer to data which is not identical to reference data."
					<< tcu::TestLog::EndMessage;

				return false;
			}
#if (DE_COMPILER == DE_COMPILER_GCC)
#pragma GCC diagnostic pop
#endif
		}
	}

	return true;
}